

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CommonCore.cpp
# Opt level: O3

void __thiscall
helics::CommonCore::loadBasicJsonInfo
          (CommonCore *this,json *base,
          function<void_(nlohmann::json_abi_v3_11_3::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>_&,_const_helics::FedInfo_&)>
          *fedLoader)

{
  value_t vVar1;
  json_value jVar2;
  uint uVar3;
  reference pvVar4;
  FedInfo **ppFVar5;
  basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>
  *pbVar6;
  long lVar7;
  ulong uVar8;
  FedInfo **ppFVar9;
  FedInfo *pFVar10;
  FedInfo **ppFVar11;
  ulong uVar12;
  json fedval;
  data local_a8;
  basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>
  *local_98;
  CommonCore *local_90;
  data local_88;
  data local_78;
  data local_60;
  data local_50;
  data local_40;
  
  local_98 = (basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>
              *)base;
  local_90 = this;
  BrokerBase::addBaseInformation(&this->super_BrokerBase,base,true);
  if ((fedLoader->super__Function_base)._M_manager != (_Manager_type)0x0) {
    nlohmann::json_abi_v3_11_3::
    basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
    ::basic_json((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
                  *)&local_40,(initializer_list_t)ZEXT816(0),false,array);
    pvVar4 = nlohmann::json_abi_v3_11_3::
             basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>
             ::operator[]<char_const>(local_98,"federates");
    vVar1 = (pvVar4->m_data).m_type;
    (pvVar4->m_data).m_type = local_40.m_type;
    jVar2 = (pvVar4->m_data).m_value;
    (pvVar4->m_data).m_value = local_40.m_value;
    local_40.m_type = vVar1;
    local_40.m_value = jVar2;
    nlohmann::json_abi_v3_11_3::
    basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
    ::data::~data(&local_40);
    if ((local_90->loopFederates).dataStorage.csize == 0) {
      uVar3 = (local_90->loopFederates).dataStorage.bsize;
      uVar8 = (ulong)(int)uVar3;
      ppFVar5 = (local_90->loopFederates).dataStorage.dataptr;
      if (uVar8 == 0x20) {
        lVar7 = (long)(local_90->loopFederates).dataStorage.dataSlotIndex;
        if (ppFVar5 == (FedInfo **)0x0) {
          ppFVar11 = (FedInfo **)
                     &gmlc::containers::
                      StableBlockVector<helics::FedInfo,5u,std::allocator<helics::FedInfo>>::end()::
                      emptyValue;
        }
        else {
          ppFVar11 = ppFVar5 + lVar7 + 1;
        }
        pFVar10 = *ppFVar11;
        uVar3 = 0;
        uVar8 = 0x20;
      }
      else {
        lVar7 = (long)(local_90->loopFederates).dataStorage.dataSlotIndex;
        ppFVar11 = ppFVar5 + lVar7;
        pFVar10 = *ppFVar11 + uVar8;
      }
    }
    else {
      ppFVar5 = (local_90->loopFederates).dataStorage.dataptr;
      pFVar10 = *ppFVar5;
      uVar8 = (ulong)(uint)(local_90->loopFederates).dataStorage.bsize;
      lVar7 = (long)(local_90->loopFederates).dataStorage.dataSlotIndex;
      uVar3 = 0;
      ppFVar11 = ppFVar5;
    }
    if (ppFVar5 == (FedInfo **)0x0) {
      ppFVar9 = (FedInfo **)
                &gmlc::containers::
                 StableBlockVector<helics::FedInfo,5u,std::allocator<helics::FedInfo>>::end()::
                 emptyValue;
    }
    else {
      ppFVar9 = ppFVar5 + lVar7 + 1;
    }
    uVar12 = 0;
    if ((int)uVar8 != 0x20) {
      uVar12 = uVar8 & 0xffffffff;
      ppFVar9 = ppFVar5 + lVar7;
    }
    while ((uVar3 != (uint)uVar12 || (ppFVar11 != ppFVar9))) {
      local_a8.m_type = null;
      local_a8.m_value.object = (object_t *)0x0;
      nlohmann::json_abi_v3_11_3::
      basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
      ::basic_json((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
                    *)&local_50,(initializer_list_t)ZEXT816(0),false,object);
      pvVar4 = nlohmann::json_abi_v3_11_3::
               basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>
               ::operator[]<char_const>
                         ((basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>
                           *)&local_a8,"attributes");
      vVar1 = (pvVar4->m_data).m_type;
      (pvVar4->m_data).m_type = local_50.m_type;
      jVar2 = (pvVar4->m_data).m_value;
      (pvVar4->m_data).m_value = local_50.m_value;
      local_50.m_type = vVar1;
      local_50.m_value = jVar2;
      nlohmann::json_abi_v3_11_3::
      basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
      ::data::~data(&local_50);
      local_78.m_type = null;
      local_78._1_7_ = 0;
      local_78.m_value.object = (object_t *)0x0;
      nlohmann::json_abi_v3_11_3::detail::
      external_constructor<(nlohmann::json_abi_v3_11_3::detail::value_t)5>::
      construct<nlohmann::json_abi_v3_11_3::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>>
                ((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
                  *)&local_78,(long)(pFVar10->fed->global_id)._M_i.gid);
      pbVar6 = (basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>
                *)nlohmann::json_abi_v3_11_3::
                  basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>
                  ::operator[]<char_const>
                            ((basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>
                              *)&local_a8,"attributes");
      pvVar4 = nlohmann::json_abi_v3_11_3::
               basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>
               ::operator[]<char_const>(pbVar6,"id");
      vVar1 = (pvVar4->m_data).m_type;
      (pvVar4->m_data).m_type = local_78.m_type;
      local_78.m_type = vVar1;
      jVar2 = (pvVar4->m_data).m_value;
      (pvVar4->m_data).m_value.object = (object_t *)local_78.m_value;
      local_78.m_value = jVar2;
      nlohmann::json_abi_v3_11_3::
      basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
      ::data::~data(&local_78);
      nlohmann::json_abi_v3_11_3::
      basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
      ::
      basic_json<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_0>
                ((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
                  *)&local_60,&pFVar10->fed->name);
      pbVar6 = (basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>
                *)nlohmann::json_abi_v3_11_3::
                  basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>
                  ::operator[]<char_const>
                            ((basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>
                              *)&local_a8,"attributes");
      pvVar4 = nlohmann::json_abi_v3_11_3::
               basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>
               ::operator[]<char_const>(pbVar6,"name");
      vVar1 = (pvVar4->m_data).m_type;
      (pvVar4->m_data).m_type = local_60.m_type;
      jVar2 = (pvVar4->m_data).m_value;
      (pvVar4->m_data).m_value = local_60.m_value;
      local_60.m_type = vVar1;
      local_60.m_value = jVar2;
      nlohmann::json_abi_v3_11_3::
      basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
      ::data::~data(&local_60);
      local_88.m_type = null;
      local_88._1_7_ = 0;
      local_88.m_value.object = (object_t *)0x0;
      nlohmann::json_abi_v3_11_3::detail::
      external_constructor<(nlohmann::json_abi_v3_11_3::detail::value_t)5>::
      construct<nlohmann::json_abi_v3_11_3::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>>
                ((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
                  *)&local_88,(long)(local_90->super_BrokerBase).global_broker_id_local.gid);
      pbVar6 = (basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>
                *)nlohmann::json_abi_v3_11_3::
                  basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>
                  ::operator[]<char_const>
                            ((basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>
                              *)&local_a8,"attributes");
      pvVar4 = nlohmann::json_abi_v3_11_3::
               basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>
               ::operator[]<char_const>(pbVar6,"parent");
      vVar1 = (pvVar4->m_data).m_type;
      (pvVar4->m_data).m_type = local_88.m_type;
      local_88.m_type = vVar1;
      jVar2 = (pvVar4->m_data).m_value;
      (pvVar4->m_data).m_value.object = (object_t *)local_88.m_value;
      local_88.m_value = jVar2;
      nlohmann::json_abi_v3_11_3::
      basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
      ::data::~data(&local_88);
      if ((fedLoader->super__Function_base)._M_manager == (_Manager_type)0x0) {
        std::__throw_bad_function_call();
      }
      (*fedLoader->_M_invoker)
                ((_Any_data *)fedLoader,
                 (basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
                  *)&local_a8,pFVar10);
      pvVar4 = nlohmann::json_abi_v3_11_3::
               basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>
               ::operator[]<char_const>(local_98,"federates");
      nlohmann::json_abi_v3_11_3::
      basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
      ::push_back(pvVar4,(basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
                          *)&local_a8);
      nlohmann::json_abi_v3_11_3::
      basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
      ::data::~data(&local_a8);
      if ((int)uVar3 < 0x1f) {
        pFVar10 = pFVar10 + 1;
        uVar3 = uVar3 + 1;
      }
      else {
        ppFVar11 = ppFVar11 + (ulong)(uVar3 - 0x1f >> 5) + 1;
        uVar3 = uVar3 + 1 & 0x1f;
        pFVar10 = (FedInfo *)((long)&(*ppFVar11)->fed + (ulong)(uVar3 << 4));
      }
    }
  }
  return;
}

Assistant:

void CommonCore::loadBasicJsonInfo(
    nlohmann::json& base,
    const std::function<void(nlohmann::json& fedval, const FedInfo& fed)>& fedLoader) const
{
    addBaseInformation(base, true);
    if (fedLoader) {
        base["federates"] = nlohmann::json::array();
        for (const auto& fed : loopFederates) {
            nlohmann::json fedval;
            fedval["attributes"] = nlohmann::json::object();
            fedval["attributes"]["id"] = fed.fed->global_id.load().baseValue();
            fedval["attributes"]["name"] = fed.fed->getIdentifier();
            fedval["attributes"]["parent"] = global_broker_id_local.baseValue();
            fedLoader(fedval, fed);
            base["federates"].push_back(std::move(fedval));
        }
    }
}